

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall ObjectTest_set_int_Test::~ObjectTest_set_int_Test(ObjectTest_set_int_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjectTest, set_int) {
	object obj;

	obj.set(1337);

	EXPECT_TRUE(obj.has<int>());
	EXPECT_EQ(obj.get<int>(), 1337);
	EXPECT_FALSE(obj.has<bool>());
	EXPECT_FALSE(obj.get<bool>());

	obj.set(7331);

	EXPECT_TRUE(obj.has<int>());
	EXPECT_EQ(obj.get<int>(), 7331);
	EXPECT_FALSE(obj.has<bool>());
	EXPECT_FALSE(obj.get<bool>());

	obj.set(0);

	EXPECT_TRUE(obj.has<int>());
	EXPECT_EQ(obj.get<int>(), 0);
	EXPECT_FALSE(obj.has<bool>());
	EXPECT_FALSE(obj.get<bool>());
}